

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArrowTableFunction::ArrowScanBind
          (ArrowTableFunction *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  reference pvVar1;
  string *name;
  uintptr_t uVar2;
  stream_factory_produce_t p_Var3;
  code *pcVar4;
  type pAVar5;
  DBConfig *config;
  pointer pAVar6;
  BinderException *this_00;
  InvalidInputException *this_01;
  _Head_base<0UL,_duckdb::ArrowScanFunctionData_*,_false> _Var7;
  templated_unique_single_t res;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  _Head_base<0UL,_duckdb::ArrowScanFunctionData_*,_false> local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  string local_60;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_40;
  ClientContext *local_38;
  
  local_38 = context;
  pvVar1 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
  if (((pvVar1->is_null != false) ||
      (pvVar1 = vector<duckdb::Value,_true>::operator[](input->inputs,1), pvVar1->is_null != false))
     || (pvVar1 = vector<duckdb::Value,_true>::operator[](input->inputs,2), pvVar1->is_null == true)
     ) {
    this_00 = (BinderException *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"arrow_scan: pointers cannot be null","");
    BinderException::BinderException(this_00,&local_60);
    __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_40._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  if ((input->ref->super_TableRef).external_dependency.internal.
      super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var7._M_head_impl = (ArrowScanFunctionData *)0x0;
  }
  else {
    name = (string *)
           shared_ptr<duckdb::ExternalDependency,_true>::operator->
                     (&(input->ref->super_TableRef).external_dependency);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"replacement_cache","");
    ExternalDependency::GetDependency((ExternalDependency *)&local_78,name);
    _Var7._M_head_impl = local_78._M_head_impl;
    local_80 = p_Stack_70;
    p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78._M_head_impl = (ArrowScanFunctionData *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  pvVar1 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
  uVar2 = Value::GetPointer(pvVar1);
  pvVar1 = vector<duckdb::Value,_true>::operator[](input->inputs,1);
  p_Var3 = (stream_factory_produce_t)Value::GetPointer(pvVar1);
  pvVar1 = vector<duckdb::Value,_true>::operator[](input->inputs,2);
  pcVar4 = (code *)Value::GetPointer(pvVar1);
  local_78._M_head_impl = (ArrowScanFunctionData *)operator_new(0xf0);
  ((local_78._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&((local_78._M_head_impl)->super_TableFunctionData).column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&((local_78._M_head_impl)->super_TableFunctionData).column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  ((local_78._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__ArrowScanFunctionData_019b4350;
  ((local_78._M_head_impl)->schema_root).arrow_schema.release = (_func_void_ArrowSchema_ptr *)0x0;
  (local_78._M_head_impl)->rows_per_thread = 0;
  ((local_78._M_head_impl)->all_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_78._M_head_impl)->all_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_78._M_head_impl)->all_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_78._M_head_impl)->lines_read).super___atomic_base<unsigned_long>._M_i = 0;
  (local_78._M_head_impl)->stream_factory_ptr = uVar2;
  (local_78._M_head_impl)->scanner_producer = p_Var3;
  ((local_78._M_head_impl)->dependency).internal.
  super___shared_ptr<duckdb::DependencyItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var7._M_head_impl;
  ((local_78._M_head_impl)->dependency).internal.
  super___shared_ptr<duckdb::DependencyItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_80;
  ((local_78._M_head_impl)->arrow_table).arrow_convert_data._M_h._M_buckets =
       &((local_78._M_head_impl)->arrow_table).arrow_convert_data._M_h._M_single_bucket;
  ((local_78._M_head_impl)->arrow_table).arrow_convert_data._M_h._M_bucket_count = 1;
  ((local_78._M_head_impl)->arrow_table).arrow_convert_data._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  ((local_78._M_head_impl)->arrow_table).arrow_convert_data._M_h._M_element_count = 0;
  ((local_78._M_head_impl)->arrow_table).arrow_convert_data._M_h._M_rehash_policy._M_max_load_factor
       = 1.0;
  ((local_78._M_head_impl)->arrow_table).arrow_convert_data._M_h._M_rehash_policy._M_next_resize = 0
  ;
  ((local_78._M_head_impl)->arrow_table).arrow_convert_data._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (local_78._M_head_impl)->projection_pushdown_enabled = true;
  pAVar5 = unique_ptr<duckdb::ArrowScanFunctionData,_std::default_delete<duckdb::ArrowScanFunctionData>,_true>
           ::operator*((unique_ptr<duckdb::ArrowScanFunctionData,_std::default_delete<duckdb::ArrowScanFunctionData>,_true>
                        *)&local_78);
  (*pcVar4)(uVar2,&pAVar5->schema_root);
  config = DBConfig::GetConfig(local_38);
  pAVar6 = unique_ptr<duckdb::ArrowScanFunctionData,_std::default_delete<duckdb::ArrowScanFunctionData>,_true>
           ::operator->((unique_ptr<duckdb::ArrowScanFunctionData,_std::default_delete<duckdb::ArrowScanFunctionData>,_true>
                         *)&local_78);
  PopulateArrowTableType(config,&pAVar6->arrow_table,&pAVar5->schema_root,names,return_types);
  QueryResult::DeduplicateColumns(names);
  pAVar6 = unique_ptr<duckdb::ArrowScanFunctionData,_std::default_delete<duckdb::ArrowScanFunctionData>,_true>
           ::operator->((unique_ptr<duckdb::ArrowScanFunctionData,_std::default_delete<duckdb::ArrowScanFunctionData>,_true>
                         *)&local_78);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(pAVar6->all_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &return_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
  ;
  if ((return_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (return_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Provided table/dataframe must have at least one column","");
    InvalidInputException::InvalidInputException(this_01,&local_60);
    __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  *(ArrowScanFunctionData **)
   local_40._M_t.
   super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
   super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = local_78._M_head_impl;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         local_40._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> ArrowTableFunction::ArrowScanBind(ClientContext &context, TableFunctionBindInput &input,
                                                           vector<LogicalType> &return_types, vector<string> &names) {
	if (input.inputs[0].IsNull() || input.inputs[1].IsNull() || input.inputs[2].IsNull()) {
		throw BinderException("arrow_scan: pointers cannot be null");
	}
	auto &ref = input.ref;

	shared_ptr<DependencyItem> dependency;
	if (ref.external_dependency) {
		// This was created during the replacement scan for Python (see python_replacement_scan.cpp)
		// this object is the owning reference to 'stream_factory_ptr' and has to be kept alive.
		dependency = ref.external_dependency->GetDependency("replacement_cache");
		D_ASSERT(dependency);
	}

	auto stream_factory_ptr = input.inputs[0].GetPointer();
	auto stream_factory_produce = (stream_factory_produce_t)input.inputs[1].GetPointer();       // NOLINT
	auto stream_factory_get_schema = (stream_factory_get_schema_t)input.inputs[2].GetPointer(); // NOLINT

	auto res = make_uniq<ArrowScanFunctionData>(stream_factory_produce, stream_factory_ptr, std::move(dependency));

	auto &data = *res;
	stream_factory_get_schema(reinterpret_cast<ArrowArrayStream *>(stream_factory_ptr), data.schema_root.arrow_schema);
	PopulateArrowTableType(DBConfig::GetConfig(context), res->arrow_table, data.schema_root, names, return_types);
	QueryResult::DeduplicateColumns(names);
	res->all_types = return_types;
	if (return_types.empty()) {
		throw InvalidInputException("Provided table/dataframe must have at least one column");
	}
	return std::move(res);
}